

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::EscBreak(void)

{
  int iVar1;
  undefined8 in_stack_ffffffffffffffc8;
  char ch;
  RegEx *in_stack_ffffffffffffffd0;
  RegEx *in_stack_fffffffffffffff0;
  RegEx *in_stack_fffffffffffffff8;
  
  ch = (char)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  if (EscBreak()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&EscBreak()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(in_stack_ffffffffffffffd0,ch);
      Break();
      YAML::operator+(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
      RegEx::~RegEx((RegEx *)0xf1ee0e);
      __cxa_atexit(RegEx::~RegEx,&EscBreak::e,&__dso_handle);
      __cxa_guard_release(&EscBreak()::e);
    }
  }
  return &EscBreak::e;
}

Assistant:

inline const RegEx& EscBreak() {
  static const RegEx e = RegEx('\\') + Break();
  return e;
}